

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O0

WidgetSizePolicy QStyleHelper::widgetSizePolicy(QWidget *widget,QStyleOption *opt)

{
  bool bVar1;
  Int IVar2;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  StateFlag in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  QWidget *local_20;
  WidgetSizePolicy local_14;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_10;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RDI;
  do {
    if (local_20 == (QWidget *)0x0) {
      bVar1 = false;
      if (in_RSI != (QWidget *)0x0) {
        local_c.super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorage<QStyle::StateFlag>)
             QFlags<QStyle::StateFlag>::operator&
                       ((QFlags<QStyle::StateFlag> *)
                        (ulong)CONCAT16(in_stack_ffffffffffffffd6,
                                        CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                                                )),in_stack_ffffffffffffffcc);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
        bVar1 = IVar2 != 0;
      }
      if (bVar1) {
        local_14 = SizeMini;
      }
      else {
        bVar1 = false;
        if (in_RSI != (QWidget *)0x0) {
          local_10.super_QFlagsStorage<QStyle::StateFlag>.i =
               (QFlagsStorage<QStyle::StateFlag>)
               QFlags<QStyle::StateFlag>::operator&
                         ((QFlags<QStyle::StateFlag> *)
                          (ulong)CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
          IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
          bVar1 = IVar2 != 0;
        }
        if (bVar1) {
          local_14 = SizeSmall;
        }
        else {
          local_14 = SizeDefault;
        }
      }
LAB_004197ba:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_14;
      }
      __stack_chk_fail();
    }
    bVar1 = QWidget::testAttribute
                      (in_RSI,CONCAT13(in_stack_ffffffffffffffd7,
                                       CONCAT12(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd4)
                                      ));
    if (bVar1) {
      local_14 = SizeMini;
      goto LAB_004197ba;
    }
    bVar1 = QWidget::testAttribute
                      (in_RSI,CONCAT13(in_stack_ffffffffffffffd7,
                                       CONCAT12(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd4)
                                      ));
    if (bVar1) {
      local_14 = SizeSmall;
      goto LAB_004197ba;
    }
    bVar1 = QWidget::testAttribute
                      (in_RSI,CONCAT13(in_stack_ffffffffffffffd7,
                                       CONCAT12(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd4)
                                      ));
    if (bVar1) {
      local_14 = SizeLarge;
      goto LAB_004197ba;
    }
    local_20 = QWidget::parentWidget((QWidget *)0x41970c);
  } while( true );
}

Assistant:

WidgetSizePolicy widgetSizePolicy(const QWidget *widget, const QStyleOption *opt)
{
    while (widget) {
        if (widget->testAttribute(Qt::WA_MacMiniSize)) {
            return SizeMini;
        } else if (widget->testAttribute(Qt::WA_MacSmallSize)) {
            return SizeSmall;
        } else if (widget->testAttribute(Qt::WA_MacNormalSize)) {
            return SizeLarge;
        }
        widget = widget->parentWidget();
    }

    if (opt && opt->state & QStyle::State_Mini)
        return SizeMini;
    else if (opt && opt->state & QStyle::State_Small)
        return SizeSmall;

    return SizeDefault;
}